

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall cmComputeLinkDepends::OrderLinkEntires(cmComputeLinkDepends *this)

{
  undefined4 in_EAX;
  cmComputeComponentGraph *this_00;
  size_type __new_size;
  int iVar1;
  int *piVar2;
  int n;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  this_00 = (cmComputeComponentGraph *)operator_new(0xd8);
  cmComputeComponentGraph::cmComputeComponentGraph(this_00,&this->EntryConstraintGraph);
  this->CCG = this_00;
  __new_size = ((long)(this_00->ComponentGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this_00->ComponentGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uStack_28 = CONCAT44((int)__new_size,(undefined4)uStack_28) & 0xffffffff00ffffff;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->ComponentVisited,__new_size,(value_type *)((long)&uStack_28 + 3));
  std::vector<int,_std::allocator<int>_>::resize
            (&this->ComponentOrder,
             ((long)(this_00->ComponentGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this_00->ComponentGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (value_type_conflict1 *)((long)&uStack_28 + 4));
  this->ComponentOrderId = uStack_28._4_4_;
  if (0 < uStack_28._4_4_) {
    iVar1 = uStack_28._4_4_ + 1;
    do {
      VisitComponent(this,iVar1 - 2);
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  if (this->DebugMode != false) {
    DisplayComponents(this);
  }
  for (piVar2 = (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar2 != (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar2 = piVar2 + 1) {
    VisitEntry(this,*piVar2);
  }
  while ((this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    VisitEntry(this,(this->PendingComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    [2]._M_parent[1]._M_color);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::OrderLinkEntires()
{
  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG = new cmComputeComponentGraph(this->EntryConstraintGraph);

  // The component graph is guaranteed to be acyclic.  Start a DFS
  // from every entry to compute a topological order for the
  // components.
  Graph const& cgraph = this->CCG->GetComponentGraph();
  int n = static_cast<int>(cgraph.size());
  this->ComponentVisited.resize(cgraph.size(), 0);
  this->ComponentOrder.resize(cgraph.size(), n);
  this->ComponentOrderId = n;
  // Run in reverse order so the topological order will preserve the
  // original order where there are no constraints.
  for(int c = n-1; c >= 0; --c)
    {
    this->VisitComponent(c);
    }

  // Display the component graph.
  if(this->DebugMode)
    {
    this->DisplayComponents();
    }

  // Start with the original link line.
  for(std::vector<int>::const_iterator i = this->OriginalEntries.begin();
      i != this->OriginalEntries.end(); ++i)
    {
    this->VisitEntry(*i);
    }

  // Now explore anything left pending.  Since the component graph is
  // guaranteed to be acyclic we know this will terminate.
  while(!this->PendingComponents.empty())
    {
    // Visit one entry from the first pending component.  The visit
    // logic will update the pending components accordingly.  Since
    // the pending components are kept in topological order this will
    // not repeat one.
    int e = *this->PendingComponents.begin()->second.Entries.begin();
    this->VisitEntry(e);
    }
}